

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O0

string * flatbuffers::kotlin::KotlinGenerator::CastToUsigned_abi_cxx11_(Type type)

{
  Type type_00;
  string *in_RDI;
  BaseType in_stack_00000008;
  undefined8 in_stack_ffffffffffffff68;
  allocator<char> *__a;
  allocator<char> local_49;
  Type local_48;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [20];
  allocator<char> local_11 [9];
  
  switch(in_stack_00000008) {
  case BASE_TYPE_UTYPE:
  case BASE_TYPE_UCHAR:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,".toUByte()",local_25);
    std::allocator<char>::~allocator(local_25);
    break;
  default:
    __a = &local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"",__a);
    std::allocator<char>::~allocator(&local_49);
    break;
  case BASE_TYPE_USHORT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,".toUShort()",&local_26);
    std::allocator<char>::~allocator(&local_26);
    break;
  case BASE_TYPE_UINT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,".toUInt()",local_11);
    std::allocator<char>::~allocator(local_11);
    break;
  case BASE_TYPE_ULONG:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,".toULong()",&local_27);
    std::allocator<char>::~allocator(&local_27);
    break;
  case BASE_TYPE_VECTOR:
    Type::VectorType(&local_48,(Type *)&stack0x00000008);
    type_00.struct_def = (StructDef *)local_48.enum_def;
    type_00._0_8_ = local_48.struct_def;
    type_00.enum_def = (EnumDef *)local_48._24_8_;
    type_00._24_8_ = in_stack_ffffffffffffff68;
    CastToUsigned_abi_cxx11_(type_00);
  }
  return in_RDI;
}

Assistant:

static std::string CastToUsigned(const Type type) {
    switch (type.base_type) {
      case BASE_TYPE_UINT: return ".toUInt()";
      case BASE_TYPE_UCHAR:
      case BASE_TYPE_UTYPE: return ".toUByte()";
      case BASE_TYPE_USHORT: return ".toUShort()";
      case BASE_TYPE_ULONG: return ".toULong()";
      case BASE_TYPE_VECTOR: return CastToUsigned(type.VectorType());
      default: return "";
    }
  }